

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  if (this->internal == other->internal) {
    return;
  }
  if (this->internal->refcount < other->internal->refcount) {
    operator=(this,other);
    return;
  }
  operator=(other,this);
  return;
}

Assistant:

void JSONNode::merge(JSONNode &) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == other.internal) return;
	   JSON_ASSERT(*this == other, JSON_TEXT("merging two nodes that aren't equal"));
	   if (internal -> refcount < other.internal -> refcount){
		  *this = other;
	   } else {
		  other = *this;
	   }
    #endif
}